

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O0

void __thiscall efsw::FileInfo::FileInfo(FileInfo *this,string *filepath,bool linkInfo)

{
  bool linkInfo_local;
  string *filepath_local;
  FileInfo *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)filepath);
  this->ModificationTime = 0;
  this->OwnerId = 0;
  this->GroupId = 0;
  this->Permissions = 0;
  this->Inode = 0;
  if (linkInfo) {
    getRealInfo(this);
  }
  else {
    getInfo(this);
  }
  return;
}

Assistant:

FileInfo::FileInfo( const std::string& filepath, bool linkInfo ) :
	Filepath( filepath ),
	ModificationTime( 0 ),
	OwnerId( 0 ),
	GroupId( 0 ),
	Permissions( 0 ),
	Inode( 0 ) {
	if ( linkInfo ) {
		getRealInfo();
	} else {
		getInfo();
	}
}